

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toPlainString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  int8_t iVar2;
  int32_t magnitude;
  int iVar3;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if ((this->flags & 1U) != 0) {
    icu_63::UnicodeString::append(__return_storage_ptr__,L'-');
  }
  if ((this->precision == 0) || (this->precision + this->scale + -1 < 0)) {
    icu_63::UnicodeString::append(__return_storage_ptr__,L'0');
  }
  magnitude = getUpperDisplayMagnitude(this);
  while( true ) {
    iVar1 = this->scale;
    iVar3 = this->rOptPos;
    if (this->rOptPos <= iVar1) {
      iVar3 = iVar1;
    }
    if (this->rReqPos < iVar1) {
      iVar3 = this->rReqPos;
    }
    if (magnitude < iVar3) break;
    if (magnitude == -1) {
      icu_63::UnicodeString::append(__return_storage_ptr__,L'.');
    }
    iVar2 = getDigit(this,magnitude);
    icu_63::UnicodeString::append(__return_storage_ptr__,iVar2 + 0x30);
    magnitude = magnitude + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toPlainString() const {
    U_ASSERT(!isApproximate);
    UnicodeString sb;
    if (isNegative()) {
        sb.append(u'-');
    }
    if (precision == 0 || getMagnitude() < 0) {
        sb.append(u'0');
    }
    for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
        if (m == -1) { sb.append(u'.'); }
        sb.append(getDigit(m) + u'0');
    }
    return sb;
}